

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O2

double * __thiscall NaDynAr<double>::fetch(NaDynAr<double> *this,int index)

{
  item *piVar1;
  undefined4 *puVar2;
  
  piVar1 = fetch_item(this,index);
  if (piVar1 == (item *)0x0) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 1;
  }
  else {
    if (piVar1->pData != (double *)0x0) {
      return piVar1->pData;
    }
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0;
  }
  __cxa_throw(puVar2,&NaException::typeinfo,0);
}

Assistant:

virtual type&	fetch (int index) {
    item	*p = fetch_item(index);

    if(NULL == p)
      throw(na_out_of_range);
    if(NULL == p->pData)
      throw(na_null_pointer);

    return *(p->pData);
  }